

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Expression> __thiscall minja::Parser::parseDictionary(Parser *this)

{
  element_type *peVar1;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  runtime_error *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long lVar6;
  Parser *in_RSI;
  char *__end;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<minja::Expression> sVar7;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
  elements;
  anon_class_16_2_3265e732 parseKeyValuePair;
  string local_a8;
  string local_88;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
  local_68;
  Parser *local_48;
  anon_class_16_2_3265e732 local_40;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"{","");
  consumeToken(&local_88,in_RSI,&local_a8,Strip);
  sVar2 = local_88._M_string_length;
  _Var5._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    _Var5._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    _Var5._M_pi = extraout_RDX_01;
  }
  if (sVar2 == 0) {
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_68.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"}","");
    consumeToken(&local_88,in_RSI,&local_a8,Strip);
    sVar2 = local_88._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (sVar2 == 0) {
      local_40.elements = &local_68;
      local_48 = this;
      parseDictionary::anon_class_16_2_3265e732::operator()(&local_40);
      do {
        if ((in_RSI->it)._M_current == (in_RSI->end)._M_current) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Expected closing brace");
LAB_001e4c98:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,",","");
        consumeToken(&local_88,in_RSI,&local_a8,Strip);
        sVar2 = local_88._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (sVar2 == 0) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"}","");
          consumeToken(&local_88,in_RSI,&local_a8,Strip);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_88._M_string_length == 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"Expected comma or closing brace in dictionary");
            goto LAB_001e4c98;
          }
          peVar1 = (in_RSI->template_str).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          this_01 = (in_RSI->template_str).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          lVar6 = (long)(in_RSI->it)._M_current - (long)(in_RSI->start)._M_current;
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          peVar4 = (element_type *)(p_Var3 + 1);
          p_Var3->_M_use_count = 1;
          p_Var3->_M_weak_count = 1;
          p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261b90;
          p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_002619e0;
          *(element_type **)&p_Var3[1]._M_use_count = peVar1;
          p_Var3[2]._vptr__Sp_counted_base = (_func_int **)this_01;
          this = local_48;
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001e4c14;
          goto LAB_001e4bfd;
        }
        parseDictionary::anon_class_16_2_3265e732::operator()(&local_40);
      } while( true );
    }
    peVar1 = (in_RSI->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this_01 = (in_RSI->template_str).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    lVar6 = (long)(in_RSI->it)._M_current - (long)(in_RSI->start)._M_current;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    peVar4 = (element_type *)(p_Var3 + 1);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00261b90;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_002619e0;
    *(element_type **)&p_Var3[1]._M_use_count = peVar1;
    p_Var3[2]._vptr__Sp_counted_base = (_func_int **)this_01;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001e4bfd:
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
LAB_001e4c14:
    p_Var3[2]._M_use_count = (int)lVar6;
    p_Var3[2]._M_weak_count = (int)((ulong)lVar6 >> 0x20);
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR_do_evaluate_00261be0;
    p_Var3[3]._vptr__Sp_counted_base =
         (_func_int **)
         local_68.
         super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)&p_Var3[3]._M_use_count =
         local_68.
         super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    p_Var3[4]._vptr__Sp_counted_base =
         (_func_int **)
         local_68.
         super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var3;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    std::
    vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ::~vector(&local_68);
    _Var5._M_pi = extraout_RDX_02;
  }
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseDictionary() {
        if (consumeToken("{").empty()) return nullptr;

        std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<Expression>>> elements;
        if (!consumeToken("}").empty()) {
            return std::make_shared<DictExpr>(get_location(), std::move(elements));
        }

        auto parseKeyValuePair = [&]() {
            auto key = parseExpression();
            if (!key) throw std::runtime_error("Expected key in dictionary");
            if (consumeToken(":").empty()) throw std::runtime_error("Expected colon betweek key & value in dictionary");
            auto value = parseExpression();
            if (!value) throw std::runtime_error("Expected value in dictionary");
            elements.emplace_back(std::pair(std::move(key), std::move(value)));
        };

        parseKeyValuePair();

        while (it != end) {
            if (!consumeToken(",").empty()) {
                parseKeyValuePair();
            } else if (!consumeToken("}").empty()) {
                return std::make_shared<DictExpr>(get_location(), std::move(elements));
            } else {
                throw std::runtime_error("Expected comma or closing brace in dictionary");
            }
        }
        throw std::runtime_error("Expected closing brace");
    }